

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeFieldWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  MessageLite *value;
  FieldType FVar1;
  LogMessage *other;
  Type *pTVar2;
  Type *pTVar3;
  int *piVar4;
  uint32 *puVar5;
  uint *puVar6;
  uint64 *puVar7;
  bool *pbVar8;
  double *pdVar9;
  float *pfVar10;
  long *plVar11;
  unsigned_long *puVar12;
  int i;
  int iVar13;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->is_repeated == true) {
    if (this->is_packed == true) {
      if (this->cached_size != 0) {
        io::CodedOutputStream::WriteVarint32(output,number * 8 + 2);
        io::CodedOutputStream::WriteVarint32(output,this->cached_size);
        FVar1 = anon_unknown_0::real_type(this->type);
        switch(FVar1) {
        case TYPE_DOUBLE:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_double_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pdVar9 = RepeatedField<double>::Get((this->field_0).repeated_double_value,iVar13);
            io::CodedOutputStream::WriteLittleEndian64(output,(uint64)*pdVar9);
          }
          break;
        case TYPE_FLOAT:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_float_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pfVar10 = RepeatedField<float>::Get((this->field_0).repeated_float_value,iVar13);
            io::CodedOutputStream::WriteLittleEndian32(output,(uint32)*pfVar10);
          }
          break;
        case TYPE_INT64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar7 = (uint64 *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13)
            ;
            io::CodedOutputStream::WriteVarint64(output,*puVar7);
          }
          break;
        case TYPE_UINT64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar12 = RepeatedField<unsigned_long>::Get
                                ((this->field_0).repeated_uint64_value,iVar13);
            io::CodedOutputStream::WriteVarint64(output,*puVar12);
          }
          break;
        case TYPE_INT32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            io::CodedOutputStream::WriteVarint32SignExtended(output,*piVar4);
          }
          break;
        case TYPE_FIXED64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar12 = RepeatedField<unsigned_long>::Get
                                ((this->field_0).repeated_uint64_value,iVar13);
            io::CodedOutputStream::WriteLittleEndian64(output,*puVar12);
          }
          break;
        case TYPE_FIXED32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
            io::CodedOutputStream::WriteLittleEndian32(output,*puVar6);
          }
          break;
        case TYPE_BOOL:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_bool_value)->current_size_;
              iVar13 = iVar13 + 1) {
            pbVar8 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,iVar13);
            io::CodedOutputStream::WriteVarint32(output,(uint)*pbVar8);
          }
          break;
        case TYPE_STRING:
        case TYPE_GROUP:
        case TYPE_MESSAGE:
        case TYPE_BYTES:
          LogMessage::LogMessage
                    (&local_58,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                     ,0x49d);
          other = LogMessage::operator<<(&local_58,"Non-primitive types can\'t be packed.");
          LogFinisher::operator=(&local_59,other);
          LogMessage::~LogMessage(&local_58);
          break;
        case TYPE_UINT32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
            io::CodedOutputStream::WriteVarint32(output,*puVar6);
          }
          break;
        case TYPE_ENUM:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            io::CodedOutputStream::WriteVarint32SignExtended(output,*piVar4);
          }
          break;
        case TYPE_SFIXED32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar5 = (uint32 *)RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            io::CodedOutputStream::WriteLittleEndian32(output,*puVar5);
          }
          break;
        case TYPE_SFIXED64:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            puVar7 = (uint64 *)RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13)
            ;
            io::CodedOutputStream::WriteLittleEndian64(output,*puVar7);
          }
          break;
        case TYPE_SINT32:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
              iVar13 = iVar13 + 1) {
            piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
            io::CodedOutputStream::WriteVarint32(output,*piVar4 >> 0x1f ^ *piVar4 * 2);
          }
          break;
        case MAX_FIELD_TYPE:
          for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
              iVar13 = iVar13 + 1) {
            plVar11 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
            io::CodedOutputStream::WriteVarint64(output,*plVar11 >> 0x3f ^ *plVar11 * 2);
          }
        }
      }
    }
    else {
      FVar1 = anon_unknown_0::real_type(this->type);
      switch(FVar1) {
      case TYPE_DOUBLE:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_double_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pdVar9 = RepeatedField<double>::Get((this->field_0).repeated_double_value,iVar13);
          WireFormatLite::WriteDouble(number,*pdVar9,output);
        }
        break;
      case TYPE_FLOAT:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_float_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pfVar10 = RepeatedField<float>::Get((this->field_0).repeated_float_value,iVar13);
          WireFormatLite::WriteFloat(number,*pfVar10,output);
        }
        break;
      case TYPE_INT64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          plVar11 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
          WireFormatLite::WriteInt64(number,*plVar11,output);
        }
        break;
      case TYPE_UINT64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar12 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar13);
          WireFormatLite::WriteUInt64(number,*puVar12,output);
        }
        break;
      case TYPE_INT32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteInt32(number,*piVar4,output);
        }
        break;
      case TYPE_FIXED64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar12 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,iVar13);
          WireFormatLite::WriteFixed64(number,*puVar12,output);
        }
        break;
      case TYPE_FIXED32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
          WireFormatLite::WriteFixed32(number,*puVar6,output);
        }
        break;
      case TYPE_BOOL:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_bool_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pbVar8 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,iVar13);
          WireFormatLite::WriteBool(number,*pbVar8,output);
        }
        break;
      case TYPE_STRING:
        for (iVar13 = 0;
            iVar13 < ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pTVar2 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteString(number,pTVar2,output);
        }
        break;
      case TYPE_GROUP:
        for (iVar13 = 0;
            iVar13 < ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pTVar3 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteGroup(number,pTVar3,output);
        }
        break;
      case TYPE_MESSAGE:
        for (iVar13 = 0;
            iVar13 < ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pTVar3 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteMessage(number,pTVar3,output);
        }
        break;
      case TYPE_BYTES:
        for (iVar13 = 0;
            iVar13 < ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          pTVar2 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             ((RepeatedPtrFieldBase *)(this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteBytes(number,pTVar2,output);
        }
        break;
      case TYPE_UINT32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_uint32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          puVar6 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,iVar13);
          WireFormatLite::WriteUInt32(number,*puVar6,output);
        }
        break;
      case TYPE_ENUM:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteEnum(number,*piVar4,output);
        }
        break;
      case TYPE_SFIXED32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteSFixed32(number,*piVar4,output);
        }
        break;
      case TYPE_SFIXED64:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          plVar11 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
          WireFormatLite::WriteSFixed64(number,*plVar11,output);
        }
        break;
      case TYPE_SINT32:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int32_value)->current_size_;
            iVar13 = iVar13 + 1) {
          piVar4 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,iVar13);
          WireFormatLite::WriteSInt32(number,*piVar4,output);
        }
        break;
      case MAX_FIELD_TYPE:
        for (iVar13 = 0; iVar13 < ((this->field_0).repeated_int64_value)->current_size_;
            iVar13 = iVar13 + 1) {
          plVar11 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,iVar13);
          WireFormatLite::WriteSInt64(number,*plVar11,output);
        }
      }
    }
  }
  else if ((this->field_0xa & 1) == 0) {
    FVar1 = anon_unknown_0::real_type(this->type);
    switch(FVar1) {
    case TYPE_DOUBLE:
      WireFormatLite::WriteDouble(number,(this->field_0).double_value,output);
      return;
    case TYPE_FLOAT:
      WireFormatLite::WriteFloat(number,(this->field_0).float_value,output);
      return;
    case TYPE_INT64:
      WireFormatLite::WriteInt64(number,(this->field_0).int64_value,output);
      return;
    case TYPE_UINT64:
      WireFormatLite::WriteUInt64(number,(this->field_0).uint64_value,output);
      return;
    case TYPE_INT32:
      WireFormatLite::WriteInt32(number,(this->field_0).int32_value,output);
      return;
    case TYPE_FIXED64:
      WireFormatLite::WriteFixed64(number,(this->field_0).uint64_value,output);
      return;
    case TYPE_FIXED32:
      WireFormatLite::WriteFixed32(number,(this->field_0).uint32_value,output);
      return;
    case TYPE_BOOL:
      WireFormatLite::WriteBool(number,(this->field_0).bool_value,output);
      return;
    case TYPE_STRING:
      WireFormatLite::WriteString(number,(this->field_0).string_value,output);
      return;
    case TYPE_GROUP:
      WireFormatLite::WriteGroup(number,(this->field_0).message_value,output);
      return;
    case TYPE_MESSAGE:
      value = (this->field_0).message_value;
      if ((this->field_0xa & 0x10) != 0) {
        (*value->_vptr_MessageLite[0xd])(value,(ulong)(uint)number,output);
        return;
      }
      WireFormatLite::WriteMessage(number,value,output);
      return;
    case TYPE_BYTES:
      WireFormatLite::WriteBytes(number,(this->field_0).string_value,output);
      return;
    case TYPE_UINT32:
      WireFormatLite::WriteUInt32(number,(this->field_0).uint32_value,output);
      return;
    case TYPE_ENUM:
      WireFormatLite::WriteEnum(number,(this->field_0).enum_value,output);
      return;
    case TYPE_SFIXED32:
      WireFormatLite::WriteSFixed32(number,(this->field_0).int32_value,output);
      return;
    case TYPE_SFIXED64:
      WireFormatLite::WriteSFixed64(number,(this->field_0).int64_value,output);
      return;
    case TYPE_SINT32:
      WireFormatLite::WriteSInt32(number,(this->field_0).int32_value,output);
      return;
    case MAX_FIELD_TYPE:
      WireFormatLite::WriteSInt64(number,(this->field_0).int64_value,output);
      return;
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeFieldWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return;

      WireFormatLite::WriteTag(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
      output->WriteVarint32(cached_size);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE##NoTag(                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE(number,                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case WireFormatLite::TYPE_##UPPERCASE:                     \
        WireFormatLite::Write##CAMELCASE(number, VALUE, output); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          lazymessage_value->WriteMessage(number, output);
        } else {
          WireFormatLite::WriteMessage(number, *message_value, output);
        }
        break;
    }
  }
}